

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp16.h
# Opt level: O2

uint16_t fp32_to_fp16<(std::float_round_style)1>(float value)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  float fVar4;
  uint uVar5;
  ushort uVar6;
  bool bVar7;
  
  uVar3 = (ushort)((uint)value >> 0x10) & 0x8000;
  fVar4 = ABS(value);
  if ((uint)fVar4 >> 0x17 == 0xff) {
    uVar6 = 0x3ff;
    if (((uint)value & 0x7fffff) == 0) {
      uVar6 = 0;
    }
    return uVar6 | uVar3 | 0x7c00;
  }
  if (0x477fffff < (uint)fVar4) {
    return uVar3 | 0x7c00;
  }
  if ((uint)fVar4 < 0x38800000) {
    if ((uint)fVar4 < 0x33000000) {
      bVar7 = fVar4 != 0.0;
      uVar6 = 0;
    }
    else {
      uVar5 = (uint)value & 0x7fffff | 0x800000;
      cVar1 = (char)((uint)fVar4 >> 0x17);
      bVar2 = 0x7d - cVar1;
      uVar6 = (ushort)((uVar5 >> (bVar2 & 0x1f) & 1) != 0);
      bVar7 = (~(uint)(-1L << (bVar2 & 0x3f)) & uVar5) != 0;
      uVar3 = (ushort)(uVar5 >> (0x7eU - cVar1 & 0x1f)) | uVar3;
    }
  }
  else {
    uVar6 = (ushort)((uint)fVar4 >> 0xc) & 1;
    bVar7 = ((uint)value & 0xfff) != 0;
    uVar3 = (ushort)((uint)fVar4 >> 0x17) * 0x400 + ((ushort)((uint)fVar4 >> 0xd) & 0x3ff) + 0x4000
            | uVar3;
  }
  return ((bVar7 | uVar3) & uVar6) + uVar3;
}

Assistant:

uint16_t fp32_to_fp16(float value)
{
    uint32_t bits;
    std::memcpy(&bits, &value, sizeof(bits));

    uint16_t hbits = (bits >> 16) & 0x8000;
    bits &= 0x7FFFFFFF;

    uint32_t exp = bits >> 23;
    if (exp == 255) {
        return hbits | 0x7C00 | (0x3FF & -static_cast<uint32_t>((bits & 0x7FFFFF) != 0));
    }
    if (exp > 142) {
        if (Rounding == std::round_toward_infinity) {
            return (hbits | 0x7C00) - (hbits >> 15);
        }
        if (Rounding == std::round_toward_neg_infinity) {
            return (hbits | 0x7BFF) + (hbits >> 15);
        }
        return (hbits | 0x7BFF) + (Rounding != std::round_toward_zero ? 1 : 0);
    }
    uint32_t g, s;
    if (exp > 112) {
        g = (bits >> 12) & 1;
        s = (bits & 0xFFF) != 0;
        hbits |= ((exp - 112) << 10) | ((bits >> 13) & 0x3FF);
    } else if (exp > 101) {
        int i = 125 - exp;
        bits = (bits & 0x7FFFFF) | 0x800000;
        g = (bits >> i) & 1;
        s = (bits & ((1L << i) - 1)) != 0;
        hbits |= bits >> (i + 1);
    } else {
        g = 0;
        s = bits != 0;
    }
    if constexpr (Rounding == std::round_to_nearest) {
        hbits += g & (s | hbits);
    } else if constexpr (Rounding == std::round_toward_infinity) {
        hbits += ~(hbits >> 15) & (s | g);
    } else if constexpr (Rounding == std::round_toward_neg_infinity) {
        hbits += (hbits >> 15) & (g | s);
    }
    return hbits;
}